

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O1

void __thiscall
cmDocumentation::PrependSection
          (cmDocumentation *this,char *name,
          vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *docs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  iterator iVar2;
  mapped_type *ppcVar3;
  mapped_type section;
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *pvVar4;
  allocator local_7a;
  allocator local_79;
  key_type local_78;
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *local_58;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_78,name,(allocator *)&local_50);
  local_58 = docs;
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection_*>_>_>
          ::find(&(this->AllSections)._M_t,&local_78);
  paVar1 = &local_78.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)iVar2._M_node == &(this->AllSections)._M_t._M_impl.super__Rb_tree_header) {
    section = (mapped_type)operator_new(0x38);
    std::__cxx11::string::string((string *)&local_50,name,&local_7a);
    cmsys::SystemTools::UpperCase(&local_78,&local_50);
    std::__cxx11::string::string((string *)section,name,&local_79);
    (section->Entries).
    super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (section->Entries).
    super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (section->Entries).
    super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    pvVar4 = local_58;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    SetSection(this,name,section);
  }
  else {
    std::__cxx11::string::string((string *)&local_78,name,(allocator *)&local_50);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection_*>_>_>
              ::operator[](&this->AllSections,&local_78);
    section = *ppcVar3;
    pvVar4 = local_58;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      pvVar4 = local_58;
    }
  }
  std::vector<cmDocumentationEntry,std::allocator<cmDocumentationEntry>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<cmDocumentationEntry_const*,std::vector<cmDocumentationEntry,std::allocator<cmDocumentationEntry>>>>
            ((vector<cmDocumentationEntry,std::allocator<cmDocumentationEntry>> *)&section->Entries,
             (section->Entries).
             super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl
             .super__Vector_impl_data._M_start,
             (pvVar4->
             super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>).
             _M_impl.super__Vector_impl_data._M_start,
             (pvVar4->
             super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>).
             _M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void cmDocumentation::PrependSection(const char *name,
                                     std::vector<cmDocumentationEntry> &docs)
{
  cmDocumentationSection *sec = 0;
  if (this->AllSections.find(name) == this->AllSections.end())
    {
    sec = new cmDocumentationSection
      (name, cmSystemTools::UpperCase(name).c_str());
    this->SetSection(name,sec);
    }
  else
    {
    sec = this->AllSections[name];
    }
  sec->Prepend(docs);
}